

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void step_cb(Fl_Value_Input *i,void *v)

{
  double s;
  Fl_Spinner *this;
  bool bVar1;
  int iVar2;
  Fl_Widget_Type *q;
  Fl_Type *pFVar3;
  Fl_Image *v_00;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar2 == 0) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1d])();
      if (iVar2 == 0) {
        Fl_Widget::deactivate((Fl_Widget *)i);
        return;
      }
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = current_widget->o[1].label_.deimage;
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = (Fl_Image *)(*(double *)&current_widget->o[1].x_ / (double)current_widget->o[1].w_);
    }
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)v_00);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    s = (i->super_Fl_Valuator).value_;
    bVar1 = false;
    pFVar3 = Fl_Type::first;
    do {
      if (pFVar3->selected != '\0') {
        iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3);
        if (iVar2 != 0) {
          iVar2 = (*pFVar3->_vptr_Fl_Type[0x1c])(pFVar3);
          if (iVar2 == 0) {
            iVar2 = (*pFVar3->_vptr_Fl_Type[0x1d])(pFVar3);
            if (iVar2 == 0) goto LAB_001866f0;
            this = (Fl_Spinner *)pFVar3[1].prev;
            this->step_ = s;
            (this->input_).super_Fl_Input_.super_Fl_Widget.type_ = '\x02' - (s != (double)(int)s);
            Fl_Spinner::update(this);
          }
          else {
            Fl_Valuator::step((Fl_Valuator *)pFVar3[1].prev,s);
          }
          Fl_Widget::redraw((Fl_Widget *)pFVar3[1].prev);
          bVar1 = true;
        }
      }
LAB_001866f0:
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void step_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_valuator()) {
      i->activate();
      i->value(((Fl_Valuator*)(current_widget->o))->step());
    } else if (current_widget->is_spinner()) {
      i->activate();
      i->value(((Fl_Spinner*)(current_widget->o))->step());
    } else {
      i->deactivate();
      return;
    }
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget_Type* q = (Fl_Widget_Type*)o;
        if (q->is_valuator()) {
          ((Fl_Valuator*)(q->o))->step(n);
          q->o->redraw();
          mod = 1;
        } else if (q->is_spinner()) {
          ((Fl_Spinner*)(q->o))->step(n);
          q->o->redraw();
          mod = 1;
        }
      }
    }
    if (mod) set_modflag(1);
  }
}